

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::ParseLight
               (Light *light,string *err,json *o,bool store_original_json_for_extras_and_extensions)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  reference pbVar6;
  string *psVar7;
  undefined7 in_register_00000009;
  string *property;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *pjVar8;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  pointer pcVar9;
  undefined1 required;
  stringstream ss;
  json_const_iterator spotIt;
  string local_210;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [7];
  ios_base local_168 [272];
  json_const_iterator local_58;
  
  local_1ec = (undefined4)
              CONCAT71(in_register_00000009,store_original_json_for_extras_and_extensions);
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  bVar4 = ParseStringProperty(&light->type,err,o,(string *)local_1e8,true,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  poVar1 = (ostream *)(local_1e8 + 0x10);
  if ((ostream *)local_1e8._0_8_ != poVar1) {
    operator_delete((void *)local_1e8._0_8_);
  }
  if (bVar4) {
    iVar5 = std::__cxx11::string::compare((char *)&light->type);
    if (iVar5 != 0) {
LAB_0011ba5a:
      pcVar9 = local_1e8 + 0x10;
      local_1e8._0_8_ = pcVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"name","");
      psVar7 = &local_210;
      paVar2 = &local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      property = (string *)local_1e8;
      required = 0;
      local_210._M_dataplus._M_p = (pointer)paVar2;
      ParseStringProperty(&light->name,err,o,property,false,psVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar9) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"color","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseNumberArrayProperty
                (&light->color,(string *)o,(json *)local_1e8,property,(bool)required,psVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar9) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"range","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseNumberProperty(&light->range,err,o,(string *)local_1e8,false,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((pointer)local_1e8._0_8_ != pcVar9) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = pcVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"intensity","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseNumberProperty(&light->intensity,err,o,(string *)local_1e8,false,&local_210);
      pjVar8 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p);
        pjVar8 = extraout_RDX_00;
      }
      if ((pointer)local_1e8._0_8_ != pcVar9) {
        operator_delete((void *)local_1e8._0_8_);
        pjVar8 = extraout_RDX_01;
      }
      ParseExtensionsProperty(&light->extensions,(string *)o,pjVar8);
      ParseExtrasProperty(&light->extras,o);
      if ((char)local_1ec != '\0') {
        local_1d8[0]._M_allocated_capacity._0_6_ = 0;
        local_1d8[0]._M_allocated_capacity._6_2_ = 0;
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (object_t *)0x0;
        local_1d8[0]._8_6_ = 0;
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_1d8[0]._M_local_buf[0xf] = -0x80;
        bVar4 = detail::FindMember(o,"extensions",(json_const_iterator *)local_1e8);
        if (bVar4) {
          pbVar6 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_1e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump(&local_210,pbVar6,-1,' ',false,strict);
          std::__cxx11::string::operator=
                    ((string *)&light->extensions_json_string,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
        }
        local_1d8[0]._M_allocated_capacity._0_6_ = 0;
        local_1d8[0]._M_allocated_capacity._6_2_ = 0;
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (object_t *)0x0;
        local_1d8[0]._8_6_ = 0;
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_1d8[0]._M_local_buf[0xf] = -0x80;
        bVar4 = detail::FindMember(o,"extras",(json_const_iterator *)local_1e8);
        if (bVar4) {
          pbVar6 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_1e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump(&local_210,pbVar6,-1,' ',false,strict);
          std::__cxx11::string::operator=((string *)&light->extras_json_string,(string *)&local_210)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar2) {
            operator_delete(local_210._M_dataplus._M_p);
            return true;
          }
          return true;
        }
        return true;
      }
      return true;
    }
    local_58.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_58.m_object = (pointer)0x0;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    bVar4 = detail::FindMember(o,"spot",&local_58);
    cVar3 = (char)poVar1;
    if (bVar4) {
      psVar7 = (string *)
               nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_58);
      if (*(char *)&(psVar7->_M_dataplus)._M_p == '\x01') {
        local_1d8[0]._M_allocated_capacity._0_6_ = 0x4372656e6e69;
        local_1d8[0]._M_allocated_capacity._6_2_ = 0x6e6f;
        local_1d8[0]._8_6_ = 0x656c676e4165;
        local_1e8._8_8_ = 0xe;
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_1e8._0_8_ = poVar1;
        ParseNumberProperty(&(light->spot).innerConeAngle,err,(json *)psVar7,(string *)local_1e8,
                            false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((ostream *)local_1e8._0_8_ != (ostream *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8[0]._M_allocated_capacity._0_6_ = 0x43726574756f;
        local_1d8[0]._M_allocated_capacity._6_2_ = 0x6e6f;
        local_1d8[0]._8_6_ = 0x656c676e4165;
        local_1e8._8_8_ = 0xe;
        local_1d8[0]._M_local_buf[0xe] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_1e8._0_8_ = (ostream *)(local_1e8 + 0x10);
        ParseNumberProperty(&(light->spot).outerConeAngle,err,(json *)psVar7,(string *)local_1e8,
                            false,&local_210);
        pjVar8 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
          pjVar8 = extraout_RDX_03;
        }
        if ((ostream *)local_1e8._0_8_ != (ostream *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_);
          pjVar8 = extraout_RDX_04;
        }
        ParseExtensionsProperty(&(light->spot).extensions,psVar7,pjVar8);
        ParseExtrasProperty(&(light->spot).extras,(json *)psVar7);
        if ((char)local_1ec != '\0') {
          local_1d8[0]._M_allocated_capacity._0_6_ = 0;
          local_1d8[0]._M_allocated_capacity._6_2_ = 0;
          local_1e8._0_8_ = (pointer)0x0;
          local_1e8._8_8_ = (object_t *)0x0;
          local_1d8[0]._8_6_ = 0;
          local_1d8[0]._M_local_buf[0xe] = '\0';
          local_1d8[0]._M_local_buf[0xf] = -0x80;
          bVar4 = detail::FindMember((json *)psVar7,"extensions",(json_const_iterator *)local_1e8);
          if (bVar4) {
            pbVar6 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_210,pbVar6,-1,' ',false,strict);
            std::__cxx11::string::operator=
                      ((string *)&(light->spot).extensions_json_string,(string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
          }
          local_1d8[0]._M_allocated_capacity._0_6_ = 0;
          local_1d8[0]._M_allocated_capacity._6_2_ = 0;
          local_1e8._0_8_ = (pointer)0x0;
          local_1e8._8_8_ = (object_t *)0x0;
          local_1d8[0]._8_6_ = 0;
          local_1d8[0]._M_local_buf[0xe] = '\0';
          local_1d8[0]._M_local_buf[0xf] = -0x80;
          bVar4 = detail::FindMember((json *)psVar7,"extras",(json_const_iterator *)local_1e8);
          if (bVar4) {
            pbVar6 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_210,pbVar6,-1,' ',false,strict);
            std::__cxx11::string::operator=
                      ((string *)&(light->spot).extras_json_string,(string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
          }
        }
        goto LAB_0011ba5a;
      }
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"\"spot\" is not a JSON object.",0x1c);
      std::ios::widen((char)*(undefined8 *)
                             (CONCAT26(local_1d8[0]._M_allocated_capacity._6_2_,
                                       (undefined6)local_1d8[0]._M_allocated_capacity) + -0x18) +
                      cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    }
    else {
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Spot light description not found.",0x21);
      std::ios::widen((char)*(undefined8 *)
                             (CONCAT26(local_1d8[0]._M_allocated_capacity._6_2_,
                                       (undefined6)local_1d8[0]._M_allocated_capacity) + -0x18) +
                      cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base(local_168);
  }
  return false;
}

Assistant:

static bool ParseLight(Light *light, std::string *err, const detail::json &o,
                       bool store_original_json_for_extras_and_extensions) {
  if (!ParseStringProperty(&light->type, err, o, "type", true)) {
    return false;
  }

  if (light->type == "spot") {
    detail::json_const_iterator spotIt;
    if (!detail::FindMember(o, "spot", spotIt)) {
      if (err) {
        std::stringstream ss;
        ss << "Spot light description not found." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    const detail::json &v = detail::GetValue(spotIt);
    if (!detail::IsObject(v)) {
      if (err) {
        std::stringstream ss;
        ss << "\"spot\" is not a JSON object." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    if (!ParseSpotLight(&light->spot, err, v,
                        store_original_json_for_extras_and_extensions)) {
      return false;
    }
  }

  ParseStringProperty(&light->name, err, o, "name", false);
  ParseNumberArrayProperty(&light->color, err, o, "color", false);
  ParseNumberProperty(&light->range, err, o, "range", false);
  ParseNumberProperty(&light->intensity, err, o, "intensity", false);

  ParseExtrasAndExtensions(light, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}